

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result_conflict1 __thiscall
testing::internal::
FunctionMocker<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
::PerformDefaultAction
          (FunctionMocker<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
           *this,ArgumentTuple *args,string *call_description)

{
  Result RVar1;
  OnCallSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *this_00;
  Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *this_01;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ArgumentTuple local_20;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 ==
      (OnCallSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
       *)0x0) {
    std::operator+(&local_40,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    RVar1 = DefaultValue<int>::Get();
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    this_01 = OnCallSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
              ::GetAction(this_00);
    local_20.
    super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
    .super__Tuple_impl<1UL,_int,_unsigned_int> =
         (args->
         super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
         ).super__Tuple_impl<1UL,_int,_unsigned_int>;
    local_20.
    super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
    .
    super__Head_base<0UL,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_false>
    ._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
         ).
         super__Head_base<0UL,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_false>
         ._M_head_impl;
    RVar1 = Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
            ::Perform(this_01,&local_20);
  }
  return RVar1;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }